

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

bool proto2_unittest::TestAllTypesLite_NestedEnum_Parse
               (string_view name,TestAllTypesLite_NestedEnum *value)

{
  bool bVar1;
  int *in_R9;
  string_view name_00;
  int int_value;
  
  name_00._M_str = (char *)&int_value;
  name_00._M_len = (size_t)name._M_str;
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((internal *)TestAllTypesLite_NestedEnum_entries,(EnumEntry *)0x3,name._M_len,
                     name_00,in_R9);
  if (bVar1) {
    *value = int_value;
  }
  return bVar1;
}

Assistant:

bool TestAllTypesLite_NestedEnum_Parse(::absl::string_view name, TestAllTypesLite_NestedEnum* PROTOBUF_NONNULL value) {
  int int_value;
  bool success = ::google::protobuf::internal::LookUpEnumValue(
      TestAllTypesLite_NestedEnum_entries, 3, name, &int_value);
  if (success) {
    *value = static_cast<TestAllTypesLite_NestedEnum>(int_value);
  }
  return success;
}